

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::Initialize
          (HdlcSimulationDataGenerator *this,U32 simulation_sample_rate,
          HdlcAnalyzerSettings *settings)

{
  int iVar1;
  ulong uVar2;
  BitState BVar3;
  double dVar4;
  HdlcAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  HdlcSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mHdlcSimulationData);
  BVar3 = (BitState)&this->mHdlcSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar3);
  SimulationChannelDescriptor::SetInitialBitState(BVar3);
  srand(5);
  dVar4 = (double)simulation_sample_rate / (double)this->mSettings->mBitRate;
  uVar2 = (ulong)dVar4;
  this->mSamplesInHalfPeriod = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  this->mSamplesInAFlag = this->mSamplesInHalfPeriod * 7;
  SimulationChannelDescriptor::Advance((int)this + 0x48);
  GenerateAbortFramesIndexes(this);
  this->mAbortByte = 0;
  this->mFrameNumber = 0;
  iVar1 = rand();
  this->mWrongFramesSeparation = iVar1 % 10 + 10;
  this->mControlValue = '\0';
  this->mAddresByteValue = '\0';
  this->mInformationByteValue = '\0';
  return;
}

Assistant:

void HdlcSimulationDataGenerator::Initialize( U32 simulation_sample_rate, HdlcAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mHdlcSimulationData.SetChannel( mSettings->mInputChannel );
    mHdlcSimulationData.SetSampleRate( simulation_sample_rate );
    mHdlcSimulationData.SetInitialBitState( BIT_LOW );

    // Initialize rng seed
    srand( 5 );

    mSamplesInHalfPeriod = U64( simulation_sample_rate / double( mSettings->mBitRate ) );
    mSamplesInAFlag = mSamplesInHalfPeriod * 7;

    mHdlcSimulationData.Advance( mSamplesInHalfPeriod * 8 ); // Advance 4 periods
    GenerateAbortFramesIndexes();
    mAbortByte = 0;
    mFrameNumber = 0;
    mWrongFramesSeparation = ( rand() % 10 ) + 10; // [15..30]

    mControlValue = 0;
    mAddresByteValue = 0;
    mInformationByteValue = 0;
}